

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool is_intersection_correct(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  byte bVar1;
  uint32_t *ans;
  uint32_t *puVar2;
  uint64_t lenA;
  uint64_t lenB;
  uint64_t uVar3;
  uint32_t *B;
  void *__ptr;
  uint32_t *out;
  roaring_bitmap_t *r;
  roaring_bitmap_t *__ptr_00;
  roaring_bitmap_t *ca;
  _Bool answer;
  size_t cardtrue;
  uint32_t *buffer;
  uint32_t *arr;
  uint32_t *arr2;
  uint32_t *arr1;
  uint64_t card;
  uint64_t card2;
  uint64_t card1;
  roaring_bitmap_t *temp;
  roaring_bitmap_t *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  roaring_bitmap_t *in_stack_ffffffffffffffa0;
  roaring_bitmap_t *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  roaring_bitmap_t *in_stack_ffffffffffffffd8;
  roaring_bitmap_t *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  roaring_bitmap_and(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ans = (uint32_t *)roaring_bitmap_get_cardinality(in_stack_ffffffffffffffa0);
  puVar2 = (uint32_t *)
           roaring_bitmap_and_cardinality(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (ans == puVar2) {
    lenA = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffa0);
    lenB = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffa0);
    uVar3 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffa0);
    puVar2 = (uint32_t *)malloc(lenA << 2);
    B = (uint32_t *)malloc(lenB << 2);
    __ptr = malloc(uVar3 << 2);
    if (((puVar2 == (uint32_t *)0x0) || (B == (uint32_t *)0x0)) || (__ptr == (void *)0x0)) {
      free(puVar2);
      free(B);
      free(__ptr);
      local_1 = false;
    }
    else {
      roaring_bitmap_to_uint32_array(in_stack_ffffffffffffff90,ans);
      roaring_bitmap_to_uint32_array(in_stack_ffffffffffffff90,ans);
      roaring_bitmap_to_uint32_array(in_stack_ffffffffffffff90,ans);
      out = (uint32_t *)malloc((lenA + lenB) * 4);
      r = (roaring_bitmap_t *)intersection_uint32(puVar2,lenA,B,lenB,out);
      bVar1 = array_equals((uint32_t *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                           ,(int32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),ans,0);
      if (!(bool)bVar1) {
        printf("\n\nbitmap1:\n");
        roaring_bitmap_printf_describe(r);
        printf("\n\nbitmap2:\n");
        roaring_bitmap_printf_describe(r);
        printf("\n\nresult:\n");
        roaring_bitmap_printf_describe(r);
        __ptr_00 = roaring_bitmap_of_ptr((size_t)in_stack_ffffffffffffff90,ans);
        printf("\n\ncorrect result:\n");
        roaring_bitmap_printf_describe(r);
        free(__ptr_00);
      }
      free(out);
      free(puVar2);
      free(B);
      free(__ptr);
      roaring_bitmap_free((roaring_bitmap_t *)0x102f2b);
      local_1 = (_Bool)(bVar1 & 1);
    }
  }
  else {
    printf("bad intersection cardinality\n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_intersection_correct(roaring_bitmap_t *bitmap1,
                             roaring_bitmap_t *bitmap2) {
    roaring_bitmap_t *temp = roaring_bitmap_and(bitmap1, bitmap2);
    if (roaring_bitmap_get_cardinality(temp) !=
        roaring_bitmap_and_cardinality(bitmap1, bitmap2)) {
        printf("bad intersection cardinality\n");
        return false;
    }

    uint64_t card1, card2, card;
    card1 = roaring_bitmap_get_cardinality(bitmap1);
    card2 = roaring_bitmap_get_cardinality(bitmap2);
    card = roaring_bitmap_get_cardinality(temp);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));

    if ((arr1 == NULL) || (arr2 == NULL) || (arr == NULL)) {
        free(arr1);
        free(arr2);
        free(arr);
        return false;
    }

    roaring_bitmap_to_uint32_array(bitmap1, arr1);
    roaring_bitmap_to_uint32_array(bitmap2, arr2);
    roaring_bitmap_to_uint32_array(temp, arr);

    uint32_t *buffer = (uint32_t *)malloc(sizeof(uint32_t) * (card1 + card2));
    size_t cardtrue = intersection_uint32(arr1, card1, arr2, card2, buffer);
    bool answer = array_equals(arr, card, buffer, cardtrue);
    if (!answer) {
        printf("\n\nbitmap1:\n");
        roaring_bitmap_printf_describe(bitmap1);  // debug
        printf("\n\nbitmap2:\n");
        roaring_bitmap_printf_describe(bitmap2);  // debug
        printf("\n\nresult:\n");
        roaring_bitmap_printf_describe(temp);  // debug
        roaring_bitmap_t *ca = roaring_bitmap_of_ptr(cardtrue, buffer);
        printf("\n\ncorrect result:\n");
        roaring_bitmap_printf_describe(ca);  // debug
        free(ca);
    }
    free(buffer);
    free(arr1);
    free(arr2);
    free(arr);
    roaring_bitmap_free(temp);
    return answer;
}